

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O1

void aom_highbd_lpf_horizontal_6_sse2
               (uint16_t *s,int p,uint8_t *_blimit,uint8_t *_limit,uint8_t *_thresh,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  long lVar37;
  long lVar38;
  short sVar39;
  short sVar41;
  undefined1 auVar40 [16];
  short sVar42;
  short sVar45;
  short sVar46;
  short sVar47;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar48 [16];
  short sVar49;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  undefined1 auVar50 [16];
  short sVar56;
  short sVar57;
  short sVar58;
  undefined4 uVar59;
  short sVar64;
  short sVar65;
  short sVar66;
  undefined4 uVar67;
  short sVar69;
  short sVar70;
  short sVar71;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  short sVar63;
  short sVar68;
  undefined1 auVar62 [16];
  short sVar72;
  short sVar74;
  short sVar75;
  undefined1 auVar73 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  ushort uVar83;
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  ushort uVar96;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  ushort uVar105;
  ushort uVar106;
  ushort uVar107;
  ushort uVar108;
  ushort uVar109;
  ushort uVar110;
  ushort uVar111;
  ushort uVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  
  lVar38 = (long)(p * 2);
  lVar37 = (long)p;
  uVar1 = *(undefined8 *)(s + -lVar37);
  uVar6 = *(undefined8 *)s;
  auVar48._8_8_ = uVar6;
  auVar48._0_8_ = uVar1;
  uVar2 = *(undefined8 *)(s + lVar37);
  uVar3 = *(undefined8 *)(s + -lVar38);
  auVar80._8_8_ = uVar3;
  auVar80._0_8_ = uVar1;
  auVar50._8_8_ = uVar2;
  auVar50._0_8_ = uVar3;
  uVar4 = *(undefined8 *)(s + -(long)(p * 3));
  uVar5 = *(undefined8 *)(s + lVar38);
  auVar61 = *(undefined1 (*) [16])_limit;
  auVar7[0xd] = 0;
  auVar7._0_13_ = auVar61._0_13_;
  auVar7[0xe] = auVar61[7];
  auVar10[0xc] = auVar61[6];
  auVar10._0_12_ = auVar61._0_12_;
  auVar10._13_2_ = auVar7._13_2_;
  auVar13[0xb] = 0;
  auVar13._0_11_ = auVar61._0_11_;
  auVar13._12_3_ = auVar10._12_3_;
  auVar16[10] = auVar61[5];
  auVar16._0_10_ = auVar61._0_10_;
  auVar16._11_4_ = auVar13._11_4_;
  auVar19[9] = 0;
  auVar19._0_9_ = auVar61._0_9_;
  auVar19._10_5_ = auVar16._10_5_;
  auVar22[8] = auVar61[4];
  auVar22._0_8_ = auVar61._0_8_;
  auVar22._9_6_ = auVar19._9_6_;
  auVar28._7_8_ = 0;
  auVar28._0_7_ = auVar22._8_7_;
  auVar31._1_8_ = SUB158(auVar28 << 0x40,7);
  auVar31[0] = auVar61[3];
  auVar31._9_6_ = 0;
  auVar32._1_10_ = SUB1510(auVar31 << 0x30,5);
  auVar32[0] = auVar61[2];
  auVar32._11_4_ = 0;
  auVar25[2] = auVar61[1];
  auVar25._0_2_ = auVar61._0_2_;
  auVar25._3_12_ = SUB1512(auVar32 << 0x20,3);
  auVar84._0_2_ = auVar61._0_2_ & 0xff;
  auVar84._2_13_ = auVar25._2_13_;
  auVar84[0xf] = 0;
  auVar60 = ZEXT416(bd - 8);
  auVar85 = psllw(auVar84,auVar60);
  auVar61 = *(undefined1 (*) [16])_thresh;
  auVar8[0xd] = 0;
  auVar8._0_13_ = auVar61._0_13_;
  auVar8[0xe] = auVar61[7];
  auVar11[0xc] = auVar61[6];
  auVar11._0_12_ = auVar61._0_12_;
  auVar11._13_2_ = auVar8._13_2_;
  auVar14[0xb] = 0;
  auVar14._0_11_ = auVar61._0_11_;
  auVar14._12_3_ = auVar11._12_3_;
  auVar17[10] = auVar61[5];
  auVar17._0_10_ = auVar61._0_10_;
  auVar17._11_4_ = auVar14._11_4_;
  auVar20[9] = 0;
  auVar20._0_9_ = auVar61._0_9_;
  auVar20._10_5_ = auVar17._10_5_;
  auVar23[8] = auVar61[4];
  auVar23._0_8_ = auVar61._0_8_;
  auVar23._9_6_ = auVar20._9_6_;
  auVar29._7_8_ = 0;
  auVar29._0_7_ = auVar23._8_7_;
  auVar33._1_8_ = SUB158(auVar29 << 0x40,7);
  auVar33[0] = auVar61[3];
  auVar33._9_6_ = 0;
  auVar34._1_10_ = SUB1510(auVar33 << 0x30,5);
  auVar34[0] = auVar61[2];
  auVar34._11_4_ = 0;
  auVar26[2] = auVar61[1];
  auVar26._0_2_ = auVar61._0_2_;
  auVar26._3_12_ = SUB1512(auVar34 << 0x20,3);
  auVar97._0_2_ = auVar61._0_2_ & 0xff;
  auVar97._2_13_ = auVar26._2_13_;
  auVar97[0xf] = 0;
  auVar98 = psllw(auVar97,auVar60);
  auVar73._8_8_ = uVar5;
  auVar73._0_8_ = uVar4;
  auVar43._8_4_ = (int)uVar2;
  auVar43._0_8_ = uVar6;
  auVar43._12_4_ = (int)((ulong)uVar2 >> 0x20);
  auVar61 = psubusw(auVar48,auVar50);
  auVar82 = psubusw(auVar50,auVar48);
  auVar82 = auVar82 | auVar61;
  sVar49 = auVar82._0_2_;
  sVar57 = auVar82._8_2_;
  auVar62._0_2_ = (ushort)(sVar57 < sVar49) * sVar49 | (ushort)(sVar57 >= sVar49) * sVar57;
  sVar51 = auVar82._2_2_;
  sVar63 = auVar82._10_2_;
  auVar62._2_2_ = (ushort)(sVar63 < sVar51) * sVar51 | (ushort)(sVar63 >= sVar51) * sVar63;
  sVar52 = auVar82._4_2_;
  sVar65 = auVar82._12_2_;
  auVar62._4_2_ = (ushort)(sVar65 < sVar52) * sVar52 | (ushort)(sVar65 >= sVar52) * sVar65;
  sVar53 = auVar82._6_2_;
  sVar68 = auVar82._14_2_;
  auVar62._6_2_ = (ushort)(sVar68 < sVar53) * sVar53 | (ushort)(sVar68 >= sVar53) * sVar68;
  sVar45 = (ushort)(0 < sVar57) * sVar57;
  auVar62._8_2_ = sVar45;
  sVar42 = (ushort)(0 < sVar63) * sVar63;
  auVar62._10_2_ = sVar42;
  sVar47 = (ushort)(0 < sVar65) * sVar65;
  auVar62._12_2_ = sVar47;
  sVar46 = (ushort)(0 < sVar68) * sVar68;
  auVar62._14_2_ = sVar46;
  auVar61 = psubusw(auVar73,auVar50);
  auVar82 = psubusw(auVar50,auVar73);
  auVar82 = auVar82 | auVar61;
  sVar54 = auVar82._0_2_;
  uVar105 = (sVar54 < (short)auVar62._0_2_) * auVar62._0_2_ |
            (ushort)(sVar54 >= (short)auVar62._0_2_) * sVar54;
  sVar54 = auVar82._2_2_;
  uVar106 = (sVar54 < (short)auVar62._2_2_) * auVar62._2_2_ |
            (ushort)(sVar54 >= (short)auVar62._2_2_) * sVar54;
  sVar54 = auVar82._4_2_;
  uVar107 = (sVar54 < (short)auVar62._4_2_) * auVar62._4_2_ |
            (ushort)(sVar54 >= (short)auVar62._4_2_) * sVar54;
  sVar54 = auVar82._6_2_;
  uVar108 = (sVar54 < (short)auVar62._6_2_) * auVar62._6_2_ |
            (ushort)(sVar54 >= (short)auVar62._6_2_) * sVar54;
  sVar54 = auVar82._8_2_;
  uVar109 = (ushort)(sVar54 < sVar45) * sVar45 | (ushort)(sVar54 >= sVar45) * sVar54;
  sVar45 = auVar82._10_2_;
  uVar110 = (ushort)(sVar45 < sVar42) * sVar42 | (ushort)(sVar45 >= sVar42) * sVar45;
  sVar42 = auVar82._12_2_;
  sVar45 = auVar82._14_2_;
  uVar111 = (ushort)(sVar42 < sVar47) * sVar47 | (ushort)(sVar42 >= sVar47) * sVar42;
  uVar112 = (ushort)(sVar45 < sVar46) * sVar46 | (ushort)(sVar45 >= sVar46) * sVar45;
  auVar62 = auVar62 ^ _DAT_004d47a0;
  auVar98 = auVar98 ^ _DAT_004d47a0;
  uVar59 = CONCAT22(-(ushort)(auVar98._2_2_ < auVar62._2_2_),
                    -(ushort)(auVar98._0_2_ < auVar62._0_2_));
  auVar61 = psubusw(auVar80,auVar43);
  auVar82 = psubusw(auVar43,auVar80);
  auVar82 = auVar82 | auVar61;
  auVar61 = paddusw(auVar82,auVar82);
  auVar99._0_8_ = auVar61._0_8_;
  auVar99._8_8_ = 0;
  auVar102._0_2_ = auVar82._8_2_ >> 1;
  auVar102._2_2_ = auVar82._10_2_ >> 1;
  auVar102._4_2_ = auVar82._12_2_ >> 1;
  auVar102._6_2_ = auVar82._14_2_ >> 1;
  auVar102._8_8_ = 0;
  auVar82 = paddusw(auVar102,auVar99);
  auVar61 = *(undefined1 (*) [16])_blimit;
  auVar9[0xd] = 0;
  auVar9._0_13_ = auVar61._0_13_;
  auVar9[0xe] = auVar61[7];
  auVar12[0xc] = auVar61[6];
  auVar12._0_12_ = auVar61._0_12_;
  auVar12._13_2_ = auVar9._13_2_;
  auVar15[0xb] = 0;
  auVar15._0_11_ = auVar61._0_11_;
  auVar15._12_3_ = auVar12._12_3_;
  auVar18[10] = auVar61[5];
  auVar18._0_10_ = auVar61._0_10_;
  auVar18._11_4_ = auVar15._11_4_;
  auVar21[9] = 0;
  auVar21._0_9_ = auVar61._0_9_;
  auVar21._10_5_ = auVar18._10_5_;
  auVar24[8] = auVar61[4];
  auVar24._0_8_ = auVar61._0_8_;
  auVar24._9_6_ = auVar21._9_6_;
  auVar30._7_8_ = 0;
  auVar30._0_7_ = auVar24._8_7_;
  auVar35._1_8_ = SUB158(auVar30 << 0x40,7);
  auVar35[0] = auVar61[3];
  auVar35._9_6_ = 0;
  auVar36._1_10_ = SUB1510(auVar35 << 0x30,5);
  auVar36[0] = auVar61[2];
  auVar36._11_4_ = 0;
  auVar27[2] = auVar61[1];
  auVar27._0_2_ = auVar61._0_2_;
  auVar27._3_12_ = SUB1512(auVar36 << 0x20,3);
  auVar113._0_2_ = auVar61._0_2_ & 0xff;
  auVar113._2_13_ = auVar27._2_13_;
  auVar113[0xf] = 0;
  auVar61 = psllw(auVar113,auVar60);
  auVar82 = auVar82 ^ _DAT_004d47a0;
  auVar61 = auVar61 ^ _DAT_004d47a0;
  auVar103._0_2_ = -(ushort)(auVar61._0_2_ < auVar82._0_2_);
  auVar103._2_2_ = -(ushort)(auVar61._2_2_ < auVar82._2_2_);
  auVar103._4_2_ = -(ushort)(auVar61._4_2_ < auVar82._4_2_);
  auVar103._6_2_ = -(ushort)(auVar61._6_2_ < auVar82._6_2_);
  auVar103._8_2_ = -(ushort)(auVar61._8_2_ < auVar82._8_2_);
  auVar103._10_2_ = -(ushort)(auVar61._10_2_ < auVar82._10_2_);
  auVar103._12_2_ = -(ushort)(auVar61._12_2_ < auVar82._12_2_);
  auVar103._14_2_ = -(ushort)(auVar61._14_2_ < auVar82._14_2_);
  auVar61 = paddusw(auVar85,_DAT_0050f120);
  auVar61 = auVar61 & auVar103;
  sVar42 = auVar61._0_2_;
  uVar105 = (ushort)((short)uVar105 < sVar42) * sVar42 | ((short)uVar105 >= sVar42) * uVar105;
  sVar42 = auVar61._2_2_;
  uVar106 = (ushort)((short)uVar106 < sVar42) * sVar42 | ((short)uVar106 >= sVar42) * uVar106;
  sVar42 = auVar61._4_2_;
  uVar107 = (ushort)((short)uVar107 < sVar42) * sVar42 | ((short)uVar107 >= sVar42) * uVar107;
  sVar42 = auVar61._6_2_;
  uVar108 = (ushort)((short)uVar108 < sVar42) * sVar42 | ((short)uVar108 >= sVar42) * uVar108;
  sVar42 = auVar61._8_2_;
  uVar109 = (ushort)((short)uVar109 < sVar42) * sVar42 | ((short)uVar109 >= sVar42) * uVar109;
  sVar42 = auVar61._10_2_;
  uVar110 = (ushort)((short)uVar110 < sVar42) * sVar42 | ((short)uVar110 >= sVar42) * uVar110;
  sVar42 = auVar61._12_2_;
  uVar111 = (ushort)((short)uVar111 < sVar42) * sVar42 | ((short)uVar111 >= sVar42) * uVar111;
  sVar42 = auVar61._14_2_;
  uVar112 = (ushort)((short)uVar112 < sVar42) * sVar42 | ((short)uVar112 >= sVar42) * uVar112;
  auVar61 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  auVar61 = pshuflw(auVar61,auVar61,0);
  uVar67 = auVar61._0_4_;
  auVar104._4_4_ = uVar67;
  auVar104._0_4_ = uVar67;
  auVar104._8_4_ = uVar67;
  auVar104._12_4_ = uVar67;
  uVar67 = (undefined4)
           (CONCAT26(-(ushort)(auVar98._6_2_ < auVar62._6_2_),
                     CONCAT24(-(ushort)(auVar98._4_2_ < auVar62._4_2_),uVar59)) >> 0x20);
  auVar114._4_4_ = uVar67;
  auVar114._0_4_ = uVar59;
  auVar114._8_4_ = uVar59;
  auVar114._12_4_ = uVar67;
  auVar100._0_2_ =
       ((short)uVar109 < (short)uVar105) * uVar105 | ((short)uVar109 >= (short)uVar105) * uVar109;
  auVar100._2_2_ =
       ((short)uVar110 < (short)uVar106) * uVar106 | ((short)uVar110 >= (short)uVar106) * uVar110;
  auVar100._4_2_ =
       ((short)uVar111 < (short)uVar107) * uVar107 | ((short)uVar111 >= (short)uVar107) * uVar111;
  auVar100._6_2_ =
       ((short)uVar112 < (short)uVar108) * uVar108 | ((short)uVar112 >= (short)uVar108) * uVar112;
  auVar100._8_2_ = (0 < (short)uVar109) * uVar109;
  auVar100._10_2_ = (0 < (short)uVar110) * uVar110;
  auVar100._12_2_ = (0 < (short)uVar111) * uVar111;
  auVar100._14_2_ = (0 < (short)uVar112) * uVar112;
  auVar98 = psubusw(auVar100,auVar85);
  auVar61 = psllw(_DAT_0050f120,ZEXT416((uint)bd));
  auVar86._8_4_ = 0xffffffff;
  auVar86._0_8_ = 0xffffffffffffffff;
  auVar86._12_4_ = 0xffffffff;
  auVar61 = paddsw(auVar61,auVar86);
  auVar82 = psubsw(auVar61,auVar104);
  auVar85 = psubsw((undefined1  [16])0x0,auVar104);
  auVar81 = psubsw(auVar80,auVar104);
  auVar61 = psubsw(auVar43,auVar104);
  auVar43 = psubsw(auVar81,auVar61);
  sVar64 = auVar82._0_2_;
  sVar42 = auVar43._0_2_;
  uVar105 = (ushort)(sVar64 < sVar42) * sVar64 | (ushort)(sVar64 >= sVar42) * sVar42;
  sVar66 = auVar82._2_2_;
  sVar42 = auVar43._2_2_;
  uVar106 = (ushort)(sVar66 < sVar42) * sVar66 | (ushort)(sVar66 >= sVar42) * sVar42;
  sVar69 = auVar82._4_2_;
  sVar42 = auVar43._4_2_;
  uVar107 = (ushort)(sVar69 < sVar42) * sVar69 | (ushort)(sVar69 >= sVar42) * sVar42;
  sVar70 = auVar82._6_2_;
  sVar42 = auVar43._6_2_;
  uVar108 = (ushort)(sVar70 < sVar42) * sVar70 | (ushort)(sVar70 >= sVar42) * sVar42;
  sVar71 = auVar82._8_2_;
  sVar42 = auVar43._8_2_;
  uVar109 = (ushort)(sVar71 < sVar42) * sVar71 | (ushort)(sVar71 >= sVar42) * sVar42;
  sVar72 = auVar82._10_2_;
  sVar42 = auVar43._10_2_;
  uVar110 = (ushort)(sVar72 < sVar42) * sVar72 | (ushort)(sVar72 >= sVar42) * sVar42;
  sVar74 = auVar82._12_2_;
  sVar42 = auVar43._12_2_;
  sVar45 = auVar43._14_2_;
  uVar111 = (ushort)(sVar74 < sVar42) * sVar74 | (ushort)(sVar74 >= sVar42) * sVar42;
  sVar75 = auVar82._14_2_;
  uVar112 = (ushort)(sVar75 < sVar45) * sVar75 | (ushort)(sVar75 >= sVar45) * sVar45;
  sVar42 = auVar85._0_2_;
  auVar82._0_2_ = (ushort)((short)uVar105 < sVar42) * sVar42 | ((short)uVar105 >= sVar42) * uVar105;
  sVar45 = auVar85._2_2_;
  auVar82._2_2_ = (ushort)((short)uVar106 < sVar45) * sVar45 | ((short)uVar106 >= sVar45) * uVar106;
  sVar46 = auVar85._4_2_;
  auVar82._4_2_ = (ushort)((short)uVar107 < sVar46) * sVar46 | ((short)uVar107 >= sVar46) * uVar107;
  sVar47 = auVar85._6_2_;
  auVar82._6_2_ = (ushort)((short)uVar108 < sVar47) * sVar47 | ((short)uVar108 >= sVar47) * uVar108;
  sVar54 = auVar85._8_2_;
  auVar82._8_2_ = (ushort)((short)uVar109 < sVar54) * sVar54 | ((short)uVar109 >= sVar54) * uVar109;
  sVar55 = auVar85._10_2_;
  auVar82._10_2_ = (ushort)((short)uVar110 < sVar55) * sVar55 | ((short)uVar110 >= sVar55) * uVar110
  ;
  sVar56 = auVar85._12_2_;
  auVar82._12_2_ = (ushort)((short)uVar111 < sVar56) * sVar56 | ((short)uVar111 >= sVar56) * uVar111
  ;
  sVar58 = auVar85._14_2_;
  auVar82._14_2_ = (ushort)((short)uVar112 < sVar58) * sVar58 | ((short)uVar112 >= sVar58) * uVar112
  ;
  auVar43 = psubsw(auVar82 >> 0x40 & auVar114,auVar82);
  auVar43 = psubsw(auVar43,auVar82);
  auVar43 = psubsw(auVar43,auVar82);
  auVar101._0_2_ = -(ushort)(auVar98._0_2_ == 0);
  auVar101._2_2_ = -(ushort)(auVar98._2_2_ == 0);
  auVar101._4_2_ = -(ushort)(auVar98._4_2_ == 0);
  auVar101._6_2_ = -(ushort)(auVar98._6_2_ == 0);
  auVar101._8_2_ = -(ushort)(auVar98._8_2_ == 0);
  auVar101._10_2_ = -(ushort)(auVar98._10_2_ == 0);
  auVar101._12_2_ = -(ushort)(auVar98._12_2_ == 0);
  auVar101._14_2_ = -(ushort)(auVar98._14_2_ == 0);
  sVar39 = auVar43._0_2_;
  uVar105 = (ushort)(sVar64 < sVar39) * sVar64 | (ushort)(sVar64 >= sVar39) * sVar39;
  sVar39 = auVar43._2_2_;
  uVar106 = (ushort)(sVar66 < sVar39) * sVar66 | (ushort)(sVar66 >= sVar39) * sVar39;
  sVar39 = auVar43._4_2_;
  uVar107 = (ushort)(sVar69 < sVar39) * sVar69 | (ushort)(sVar69 >= sVar39) * sVar39;
  sVar39 = auVar43._6_2_;
  uVar108 = (ushort)(sVar70 < sVar39) * sVar70 | (ushort)(sVar70 >= sVar39) * sVar39;
  sVar39 = auVar43._8_2_;
  uVar109 = (ushort)(sVar71 < sVar39) * sVar71 | (ushort)(sVar71 >= sVar39) * sVar39;
  sVar39 = auVar43._10_2_;
  uVar110 = (ushort)(sVar72 < sVar39) * sVar72 | (ushort)(sVar72 >= sVar39) * sVar39;
  sVar39 = auVar43._12_2_;
  sVar41 = auVar43._14_2_;
  uVar111 = (ushort)(sVar74 < sVar39) * sVar74 | (ushort)(sVar74 >= sVar39) * sVar39;
  uVar112 = (ushort)(sVar75 < sVar41) * sVar75 | (ushort)(sVar75 >= sVar41) * sVar41;
  auVar76._0_2_ = (ushort)((short)uVar105 < sVar42) * sVar42 | ((short)uVar105 >= sVar42) * uVar105;
  auVar76._2_2_ = (ushort)((short)uVar106 < sVar45) * sVar45 | ((short)uVar106 >= sVar45) * uVar106;
  auVar76._4_2_ = (ushort)((short)uVar107 < sVar46) * sVar46 | ((short)uVar107 >= sVar46) * uVar107;
  auVar76._6_2_ = (ushort)((short)uVar108 < sVar47) * sVar47 | ((short)uVar108 >= sVar47) * uVar108;
  auVar76._8_2_ = (ushort)((short)uVar109 < sVar54) * sVar54 | ((short)uVar109 >= sVar54) * uVar109;
  auVar76._10_2_ = (ushort)((short)uVar110 < sVar55) * sVar55 | ((short)uVar110 >= sVar55) * uVar110
  ;
  auVar76._12_2_ = (ushort)((short)uVar111 < sVar56) * sVar56 | ((short)uVar111 >= sVar56) * uVar111
  ;
  auVar76._14_2_ = (ushort)((short)uVar112 < sVar58) * sVar58 | ((short)uVar112 >= sVar58) * uVar112
  ;
  auVar76 = auVar76 & auVar101;
  auVar85._0_8_ = auVar76._0_8_;
  auVar85._8_4_ = auVar76._0_4_;
  auVar85._12_4_ = auVar76._4_4_;
  auVar43 = paddsw(auVar85,_DAT_0050f130);
  sVar39 = auVar43._0_2_;
  uVar105 = (ushort)(sVar64 < sVar39) * sVar64 | (ushort)(sVar64 >= sVar39) * sVar39;
  sVar39 = auVar43._2_2_;
  uVar106 = (ushort)(sVar66 < sVar39) * sVar66 | (ushort)(sVar66 >= sVar39) * sVar39;
  sVar39 = auVar43._4_2_;
  uVar107 = (ushort)(sVar69 < sVar39) * sVar69 | (ushort)(sVar69 >= sVar39) * sVar39;
  sVar39 = auVar43._6_2_;
  uVar108 = (ushort)(sVar70 < sVar39) * sVar70 | (ushort)(sVar70 >= sVar39) * sVar39;
  sVar39 = auVar43._8_2_;
  uVar109 = (ushort)(sVar71 < sVar39) * sVar71 | (ushort)(sVar71 >= sVar39) * sVar39;
  sVar39 = auVar43._10_2_;
  uVar110 = (ushort)(sVar72 < sVar39) * sVar72 | (ushort)(sVar72 >= sVar39) * sVar39;
  sVar39 = auVar43._12_2_;
  sVar41 = auVar43._14_2_;
  uVar111 = (ushort)(sVar74 < sVar39) * sVar74 | (ushort)(sVar74 >= sVar39) * sVar39;
  uVar112 = (ushort)(sVar75 < sVar41) * sVar75 | (ushort)(sVar75 >= sVar41) * sVar41;
  auVar98._0_2_ = (ushort)((short)uVar105 < sVar42) * sVar42 | ((short)uVar105 >= sVar42) * uVar105;
  auVar98._2_2_ = (ushort)((short)uVar106 < sVar45) * sVar45 | ((short)uVar106 >= sVar45) * uVar106;
  auVar98._4_2_ = (ushort)((short)uVar107 < sVar46) * sVar46 | ((short)uVar107 >= sVar46) * uVar107;
  auVar98._6_2_ = (ushort)((short)uVar108 < sVar47) * sVar47 | ((short)uVar108 >= sVar47) * uVar108;
  auVar98._8_2_ = (ushort)((short)uVar109 < sVar54) * sVar54 | ((short)uVar109 >= sVar54) * uVar109;
  auVar98._10_2_ = (ushort)((short)uVar110 < sVar55) * sVar55 | ((short)uVar110 >= sVar55) * uVar110
  ;
  auVar98._12_2_ = (ushort)((short)uVar111 < sVar56) * sVar56 | ((short)uVar111 >= sVar56) * uVar111
  ;
  auVar98._14_2_ = (ushort)((short)uVar112 < sVar58) * sVar58 | ((short)uVar112 >= sVar58) * uVar112
  ;
  auVar43 = psraw(auVar98,3);
  auVar77._0_2_ = auVar43._0_2_ + 1;
  auVar77._2_2_ = auVar43._2_2_ + 1;
  auVar77._4_2_ = auVar43._4_2_ + 1;
  auVar77._6_2_ = auVar43._6_2_ + 1;
  auVar77._8_2_ = auVar43._0_2_ + 1;
  auVar77._10_2_ = auVar43._2_2_ + 1;
  auVar77._12_2_ = auVar43._4_2_ + 1;
  auVar77._14_2_ = auVar43._6_2_ + 1;
  auVar82 = psraw(auVar77,1);
  auVar87._8_8_ = SUB168(~auVar114 & auVar82,8);
  auVar87._0_8_ = auVar43._8_8_;
  auVar44._8_8_ = SUB168(~auVar114 & auVar82,0);
  auVar44._0_8_ = auVar43._0_8_;
  auVar61 = psubsw(auVar61,auVar44);
  auVar43 = paddsw(auVar87,auVar81);
  sVar39 = auVar61._0_2_;
  uVar105 = (ushort)(sVar64 < sVar39) * sVar64 | (ushort)(sVar64 >= sVar39) * sVar39;
  sVar39 = auVar61._2_2_;
  uVar106 = (ushort)(sVar66 < sVar39) * sVar66 | (ushort)(sVar66 >= sVar39) * sVar39;
  sVar39 = auVar61._4_2_;
  uVar107 = (ushort)(sVar69 < sVar39) * sVar69 | (ushort)(sVar69 >= sVar39) * sVar39;
  sVar39 = auVar61._6_2_;
  uVar108 = (ushort)(sVar70 < sVar39) * sVar70 | (ushort)(sVar70 >= sVar39) * sVar39;
  sVar39 = auVar61._8_2_;
  uVar109 = (ushort)(sVar71 < sVar39) * sVar71 | (ushort)(sVar71 >= sVar39) * sVar39;
  sVar39 = auVar61._10_2_;
  uVar110 = (ushort)(sVar72 < sVar39) * sVar72 | (ushort)(sVar72 >= sVar39) * sVar39;
  sVar39 = auVar61._12_2_;
  sVar41 = auVar61._14_2_;
  uVar111 = (ushort)(sVar74 < sVar39) * sVar74 | (ushort)(sVar74 >= sVar39) * sVar39;
  uVar112 = (ushort)(sVar75 < sVar41) * sVar75 | (ushort)(sVar75 >= sVar41) * sVar41;
  sVar39 = auVar43._0_2_;
  uVar83 = (ushort)(sVar64 < sVar39) * sVar64 | (ushort)(sVar64 >= sVar39) * sVar39;
  sVar64 = auVar43._2_2_;
  uVar90 = (ushort)(sVar66 < sVar64) * sVar66 | (ushort)(sVar66 >= sVar64) * sVar64;
  sVar64 = auVar43._4_2_;
  uVar91 = (ushort)(sVar69 < sVar64) * sVar69 | (ushort)(sVar69 >= sVar64) * sVar64;
  sVar64 = auVar43._6_2_;
  uVar92 = (ushort)(sVar70 < sVar64) * sVar70 | (ushort)(sVar70 >= sVar64) * sVar64;
  sVar64 = auVar43._8_2_;
  uVar93 = (ushort)(sVar71 < sVar64) * sVar71 | (ushort)(sVar71 >= sVar64) * sVar64;
  sVar64 = auVar43._10_2_;
  uVar94 = (ushort)(sVar72 < sVar64) * sVar72 | (ushort)(sVar72 >= sVar64) * sVar64;
  sVar64 = auVar43._12_2_;
  sVar66 = auVar43._14_2_;
  uVar95 = (ushort)(sVar74 < sVar64) * sVar74 | (ushort)(sVar74 >= sVar64) * sVar64;
  uVar96 = (ushort)(sVar75 < sVar66) * sVar75 | (ushort)(sVar75 >= sVar66) * sVar66;
  auVar61._0_2_ = (ushort)((short)uVar105 < sVar42) * sVar42 | ((short)uVar105 >= sVar42) * uVar105;
  auVar61._2_2_ = (ushort)((short)uVar106 < sVar45) * sVar45 | ((short)uVar106 >= sVar45) * uVar106;
  auVar61._4_2_ = (ushort)((short)uVar107 < sVar46) * sVar46 | ((short)uVar107 >= sVar46) * uVar107;
  auVar61._6_2_ = (ushort)((short)uVar108 < sVar47) * sVar47 | ((short)uVar108 >= sVar47) * uVar108;
  auVar61._8_2_ = (ushort)((short)uVar109 < sVar54) * sVar54 | ((short)uVar109 >= sVar54) * uVar109;
  auVar61._10_2_ = (ushort)((short)uVar110 < sVar55) * sVar55 | ((short)uVar110 >= sVar55) * uVar110
  ;
  auVar61._12_2_ = (ushort)((short)uVar111 < sVar56) * sVar56 | ((short)uVar111 >= sVar56) * uVar111
  ;
  auVar61._14_2_ = (ushort)((short)uVar112 < sVar58) * sVar58 | ((short)uVar112 >= sVar58) * uVar112
  ;
  auVar88._0_2_ = (ushort)((short)uVar83 < sVar42) * sVar42 | ((short)uVar83 >= sVar42) * uVar83;
  auVar88._2_2_ = (ushort)((short)uVar90 < sVar45) * sVar45 | ((short)uVar90 >= sVar45) * uVar90;
  auVar88._4_2_ = (ushort)((short)uVar91 < sVar46) * sVar46 | ((short)uVar91 >= sVar46) * uVar91;
  auVar88._6_2_ = (ushort)((short)uVar92 < sVar47) * sVar47 | ((short)uVar92 >= sVar47) * uVar92;
  auVar88._8_2_ = (ushort)((short)uVar93 < sVar54) * sVar54 | ((short)uVar93 >= sVar54) * uVar93;
  auVar88._10_2_ = (ushort)((short)uVar94 < sVar55) * sVar55 | ((short)uVar94 >= sVar55) * uVar94;
  auVar88._12_2_ = (ushort)((short)uVar95 < sVar56) * sVar56 | ((short)uVar95 >= sVar56) * uVar95;
  auVar88._14_2_ = (ushort)((short)uVar96 < sVar58) * sVar58 | ((short)uVar96 >= sVar58) * uVar96;
  auVar61 = paddsw(auVar61,auVar104);
  auVar85 = paddsw(auVar88,auVar104);
  auVar43 = psubusw(auVar73,auVar48);
  auVar82 = psubusw(auVar48,auVar73);
  auVar82 = auVar82 | auVar43;
  sVar42 = auVar82._0_2_;
  uVar105 = (ushort)(sVar42 < sVar49) * sVar49 | (ushort)(sVar42 >= sVar49) * sVar42;
  sVar42 = auVar82._2_2_;
  uVar106 = (ushort)(sVar42 < sVar51) * sVar51 | (ushort)(sVar42 >= sVar51) * sVar42;
  sVar42 = auVar82._4_2_;
  uVar107 = (ushort)(sVar42 < sVar52) * sVar52 | (ushort)(sVar42 >= sVar52) * sVar42;
  sVar42 = auVar82._6_2_;
  uVar108 = (ushort)(sVar42 < sVar53) * sVar53 | (ushort)(sVar42 >= sVar53) * sVar42;
  sVar42 = auVar82._8_2_;
  uVar109 = (ushort)(sVar42 < sVar57) * sVar57 | (ushort)(sVar42 >= sVar57) * sVar42;
  sVar42 = auVar82._10_2_;
  uVar110 = (ushort)(sVar42 < sVar63) * sVar63 | (ushort)(sVar42 >= sVar63) * sVar42;
  sVar42 = auVar82._12_2_;
  sVar45 = auVar82._14_2_;
  uVar111 = (ushort)(sVar42 < sVar65) * sVar65 | (ushort)(sVar42 >= sVar65) * sVar42;
  uVar112 = (ushort)(sVar45 < sVar68) * sVar68 | (ushort)(sVar45 >= sVar68) * sVar45;
  auVar43 = psllw(_DAT_0050f120,auVar60);
  auVar60._0_2_ =
       ((short)uVar109 < (short)uVar105) * uVar105 | ((short)uVar109 >= (short)uVar105) * uVar109;
  auVar60._2_2_ =
       ((short)uVar110 < (short)uVar106) * uVar106 | ((short)uVar110 >= (short)uVar106) * uVar110;
  auVar60._4_2_ =
       ((short)uVar111 < (short)uVar107) * uVar107 | ((short)uVar111 >= (short)uVar107) * uVar111;
  auVar60._6_2_ =
       ((short)uVar112 < (short)uVar108) * uVar108 | ((short)uVar112 >= (short)uVar108) * uVar112;
  auVar60._8_2_ = (0 < (short)uVar109) * uVar109;
  auVar60._10_2_ = (0 < (short)uVar110) * uVar110;
  auVar60._12_2_ = (0 < (short)uVar111) * uVar111;
  auVar60._14_2_ = (0 < (short)uVar112) * uVar112;
  auVar43 = psubusw(auVar60,auVar43);
  auVar81._0_2_ = -(ushort)(auVar43._0_2_ == 0);
  auVar81._2_2_ = -(ushort)(auVar43._2_2_ == 0);
  auVar81._4_2_ = -(ushort)(auVar43._4_2_ == 0);
  auVar81._6_2_ = -(ushort)(auVar43._6_2_ == 0);
  auVar81._8_2_ = -(ushort)(auVar43._8_2_ == 0);
  auVar81._10_2_ = -(ushort)(auVar43._10_2_ == 0);
  auVar81._12_2_ = -(ushort)(auVar43._12_2_ == 0);
  auVar81._14_2_ = -(ushort)(auVar43._14_2_ == 0);
  auVar81 = auVar81 & auVar101;
  auVar78._0_8_ = auVar81._0_8_;
  auVar78._8_4_ = auVar81._0_4_;
  auVar78._12_4_ = auVar81._4_4_;
  auVar79._0_2_ = -(ushort)(auVar81._0_2_ == 0);
  auVar79._2_2_ = -(ushort)(auVar81._2_2_ == 0);
  auVar79._4_2_ = -(ushort)(auVar81._4_2_ == 0);
  auVar79._6_2_ = -(ushort)(auVar81._6_2_ == 0);
  auVar79._8_2_ = -(ushort)(auVar81._0_2_ == 0);
  auVar79._10_2_ = -(ushort)(auVar81._2_2_ == 0);
  auVar79._12_2_ = -(ushort)(auVar81._4_2_ == 0);
  auVar79._14_2_ = -(ushort)(auVar81._6_2_ == 0);
  if ((ushort)((ushort)(SUB161(auVar79 >> 7,0) & 1) | (ushort)(SUB161(auVar79 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar79 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar79 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar79 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar79 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar79 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar79 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar79 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar79 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar79 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar79 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar79 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar79 >> 0x6f,0) & 1) << 0xd |
               (ushort)((byte)(auVar79._14_2_ >> 7) & 1) << 0xe | auVar79._14_2_ & 0x8000) != 0xffff
     ) {
    sVar58 = (short)uVar1 + (short)uVar3;
    sVar51 = (short)((ulong)uVar3 >> 0x10);
    sVar45 = (short)((ulong)uVar1 >> 0x10);
    sVar64 = sVar45 + sVar51;
    sVar52 = (short)((ulong)uVar3 >> 0x20);
    sVar46 = (short)((ulong)uVar1 >> 0x20);
    sVar66 = sVar46 + sVar52;
    sVar53 = (short)((ulong)uVar3 >> 0x30);
    sVar47 = (short)((ulong)uVar1 >> 0x30);
    sVar69 = sVar47 + sVar53;
    sVar54 = (short)((ulong)uVar2 >> 0x10);
    sVar70 = (short)((ulong)uVar6 >> 0x10);
    sVar55 = (short)((ulong)uVar2 >> 0x20);
    sVar71 = (short)((ulong)uVar6 >> 0x20);
    sVar72 = (short)((ulong)uVar6 >> 0x30);
    sVar56 = (short)((ulong)uVar2 >> 0x30);
    sVar49 = (short)uVar3 + (short)uVar4;
    sVar74 = (short)((ulong)uVar4 >> 0x10);
    sVar51 = sVar51 + sVar74;
    sVar75 = (short)((ulong)uVar4 >> 0x20);
    sVar52 = sVar52 + sVar75;
    sVar39 = (short)((ulong)uVar4 >> 0x30);
    sVar53 = sVar53 + sVar39;
    sVar41 = (short)((ulong)uVar5 >> 0x10);
    sVar57 = (short)((ulong)uVar5 >> 0x20);
    sVar63 = (short)((ulong)uVar5 >> 0x30);
    sVar42 = (short)uVar1 + sVar58 + sVar49 + 4;
    sVar45 = sVar45 + sVar64 + sVar51 + 4;
    sVar46 = sVar46 + sVar66 + sVar52 + 4;
    sVar47 = sVar47 + sVar69 + sVar53 + 4;
    uVar105 = (short)uVar6 * 2 + (short)uVar2 + sVar42;
    uVar106 = sVar70 * 2 + sVar54 + sVar45;
    uVar107 = sVar71 * 2 + sVar55 + sVar46;
    uVar108 = sVar72 * 2 + sVar56 + sVar47;
    auVar89._0_2_ = uVar105 >> 3;
    auVar89._2_2_ = uVar106 >> 3;
    auVar89._4_2_ = uVar107 >> 3;
    auVar89._6_2_ = uVar108 >> 3;
    auVar89._8_2_ = (ushort)((short)uVar4 * 2 + (short)uVar6 + sVar42) >> 3;
    auVar89._10_2_ = (ushort)(sVar74 * 2 + sVar70 + sVar45) >> 3;
    auVar89._12_2_ = (ushort)(sVar75 * 2 + sVar71 + sVar46) >> 3;
    auVar89._14_2_ = (ushort)(sVar39 * 2 + sVar72 + sVar47) >> 3;
    uVar105 = (((short)uVar2 + (short)uVar5) - sVar49) + uVar105;
    uVar106 = ((sVar54 + sVar41) - sVar51) + uVar106;
    uVar107 = ((sVar55 + sVar57) - sVar52) + uVar107;
    uVar108 = ((sVar56 + sVar63) - sVar53) + uVar108;
    auVar40._0_2_ = uVar105 >> 3;
    auVar40._2_2_ = uVar106 >> 3;
    auVar40._4_2_ = uVar107 >> 3;
    auVar40._6_2_ = uVar108 >> 3;
    auVar40._8_2_ = (ushort)(((short)uVar5 * 2 - sVar58) + uVar105) >> 3;
    auVar40._10_2_ = (ushort)((sVar41 * 2 - sVar64) + uVar106) >> 3;
    auVar40._12_2_ = (ushort)((sVar57 * 2 - sVar66) + uVar107) >> 3;
    auVar40._14_2_ = (ushort)((sVar63 * 2 - sVar69) + uVar108) >> 3;
    auVar61 = auVar40 & auVar78 | ~auVar78 & auVar61;
    auVar85 = auVar89 & auVar78 | ~auVar78 & auVar85;
  }
  *(long *)(s + -lVar38) = auVar85._8_8_;
  *(long *)(s + -lVar37) = auVar85._0_8_;
  *(long *)s = auVar61._0_8_;
  *(long *)(s + lVar37) = auVar61._8_8_;
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_6_sse2(uint16_t *s, int p,
                                      const uint8_t *_blimit,
                                      const uint8_t *_limit,
                                      const uint8_t *_thresh, int bd) {
  __m128i p2, p1, p0, q0, q1, q2, p1p0_out, q1q0_out;

  p2 = _mm_loadl_epi64((__m128i *)(s - 3 * p));
  p1 = _mm_loadl_epi64((__m128i *)(s - 2 * p));
  p0 = _mm_loadl_epi64((__m128i *)(s - 1 * p));
  q0 = _mm_loadl_epi64((__m128i *)(s + 0 * p));
  q1 = _mm_loadl_epi64((__m128i *)(s + 1 * p));
  q2 = _mm_loadl_epi64((__m128i *)(s + 2 * p));

  highbd_lpf_internal_6_sse2(&p2, &p1, &p0, &q0, &q1, &q2, &p1p0_out, &q1q0_out,
                             _blimit, _limit, _thresh, bd);

  _mm_storel_epi64((__m128i *)(s - 2 * p), _mm_srli_si128(p1p0_out, 8));
  _mm_storel_epi64((__m128i *)(s - 1 * p), p1p0_out);
  _mm_storel_epi64((__m128i *)(s + 0 * p), q1q0_out);
  _mm_storel_epi64((__m128i *)(s + 1 * p), _mm_srli_si128(q1q0_out, 8));
}